

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_0::SocketAddress::SocketAddress(SocketAddress *this,void *sockaddr,uint len)

{
  Fault f;
  uint len_local;
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  
  _kjCondition.left = &len_local;
  this->addrlen = len;
  this->wildcard = false;
  _kjCondition.right = 0x80;
  _kjCondition.op.content.ptr = " <= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = len < 0x81;
  len_local = len;
  if (_kjCondition.result) {
    memcpy(&this->addr,sockaddr,(ulong)len);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&,char_const(&)[40]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x37c,FAILED,"len <= sizeof(addr)",
             "_kjCondition,\"Sorry, your sockaddr is too big for me.\"",&_kjCondition,
             (char (*) [40])"Sorry, your sockaddr is too big for me.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

SocketAddress(const void* sockaddr, uint len): addrlen(len) {
    KJ_REQUIRE(len <= sizeof(addr), "Sorry, your sockaddr is too big for me.");
    memcpy(&addr.generic, sockaddr, len);
  }